

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O1

void update_lcp<unsigned_long>
               (sa_node_n *x,vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP,
               uint64_t *lcp_values)

{
  ulong uVar1;
  
  uVar1 = x->first_A;
  if ((x->first_TERM < uVar1) && (uVar1 != x->last)) {
    (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = x->depth;
    *lcp_values = *lcp_values + 1;
  }
  uVar1 = x->first_C;
  if ((x->first_A < uVar1) && (uVar1 != x->last)) {
    (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = x->depth;
    *lcp_values = *lcp_values + 1;
  }
  uVar1 = x->first_G;
  if ((x->first_C < uVar1) && (uVar1 != x->last)) {
    (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = x->depth;
    *lcp_values = *lcp_values + 1;
  }
  uVar1 = x->first_N;
  if ((x->first_G < uVar1) && (uVar1 != x->last)) {
    (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = x->depth;
    *lcp_values = *lcp_values + 1;
  }
  uVar1 = x->first_T;
  if ((x->first_N < uVar1) && (uVar1 != x->last)) {
    (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1] = x->depth;
    *lcp_values = *lcp_values + 1;
  }
  return;
}

Assistant:

void update_lcp(sa_node_n & x, vector<lcp_int_t> & LCP, uint64_t & lcp_values){

	assert(x.first_A >= x.first_TERM);
	assert(x.first_C >= x.first_A);
	assert(x.first_G >= x.first_C);
	assert(x.first_N >= x.first_G);
	assert(x.first_T >= x.first_N);

	assert(number_of_children(x) >= 2);

	lcp_int_t nil = ~lcp_int_t(0);

	if(has_child_TERM(x) and x.first_A != x.last){
		assert(LCP[x.first_A]==nil);
		LCP[x.first_A] = x.depth;
		lcp_values++;
	}
	if(has_child_A(x) and x.first_C != x.last){
		assert(LCP[x.first_C]==nil);
		LCP[x.first_C] = x.depth;
		lcp_values++;
	}
	if(has_child_C(x) and x.first_G != x.last){
		assert(LCP[x.first_G]==nil);
		LCP[x.first_G] = x.depth;
		lcp_values++;
	}
	if(has_child_G(x) and x.first_N != x.last){
		assert(LCP[x.first_N]==nil);
		LCP[x.first_N] = x.depth;
		lcp_values++;
	}
	if(has_child_N(x) and x.first_T != x.last){
		assert(LCP[x.first_T]==nil);
		LCP[x.first_T] = x.depth;
		lcp_values++;
	}

}